

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

AppendResult __thiscall
metaf::MinMaxTemperatureGroup::appendForecast(MinMaxTemperatureGroup *this,string *group)

{
  bool bVar1;
  uint uVar2;
  MinMaxTemperatureGroup *pMVar3;
  float *pfVar4;
  long in_RDI;
  optional<metaf::MinMaxTemperatureGroup> nextGroup;
  string *in_stack_000000d0;
  optional<metaf::MetafTime> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  
  bVar1 = Temperature::isReported((Temperature *)0x24bb3d);
  if (((bVar1) && (bVar1 = Temperature::isReported((Temperature *)0x24bb51), bVar1)) &&
     ((*(byte *)(in_RDI + 0x44) & 1) == 0)) {
    return NOT_APPENDED;
  }
  fromForecast(in_stack_000000d0);
  bVar1 = std::optional<metaf::MinMaxTemperatureGroup>::has_value
                    ((optional<metaf::MinMaxTemperatureGroup> *)0x24bb8e);
  if (!bVar1) {
    return NOT_APPENDED;
  }
  uVar2 = (uint)(*(byte *)(in_RDI + 0x44) & 1);
  pMVar3 = std::optional<metaf::MinMaxTemperatureGroup>::operator->
                     ((optional<metaf::MinMaxTemperatureGroup> *)0x24bbbd);
  if (uVar2 != (pMVar3->isIncomplete & 1)) {
    return NOT_APPENDED;
  }
  if ((*(byte *)(in_RDI + 0x44) & 1) == 0) {
    bVar1 = Temperature::isReported((Temperature *)0x24bbfe);
    if (bVar1) {
      std::optional<metaf::MinMaxTemperatureGroup>::operator->
                ((optional<metaf::MinMaxTemperatureGroup> *)0x24bc0e);
      bVar1 = Temperature::isReported((Temperature *)0x24bc1a);
      if (bVar1) {
        return NOT_APPENDED;
      }
    }
    bVar1 = Temperature::isReported((Temperature *)0x24bc3e);
    if (bVar1) {
      std::optional<metaf::MinMaxTemperatureGroup>::operator->
                ((optional<metaf::MinMaxTemperatureGroup> *)0x24bc4e);
      bVar1 = Temperature::isReported((Temperature *)0x24bc5a);
      if (bVar1) {
        return NOT_APPENDED;
      }
    }
    bVar1 = Temperature::isReported((Temperature *)0x24bc7e);
    if (!bVar1) {
      std::optional<metaf::MinMaxTemperatureGroup>::operator->
                ((optional<metaf::MinMaxTemperatureGroup> *)0x24bc8c);
      bVar1 = Temperature::isReported((Temperature *)0x24bc98);
      if (bVar1) {
        pMVar3 = std::optional<metaf::MinMaxTemperatureGroup>::operator->
                           ((optional<metaf::MinMaxTemperatureGroup> *)0x24bca8);
        *(_Optional_payload_base<int> *)(in_RDI + 4) =
             (pMVar3->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>;
        *(undefined2 *)(in_RDI + 0xc) = *(undefined2 *)&(pMVar3->minTemp).freezing;
        pMVar3 = std::optional<metaf::MinMaxTemperatureGroup>::operator->
                           ((optional<metaf::MinMaxTemperatureGroup> *)0x24bcca);
        *(_Optional_payload_base<unsigned_int> *)(in_RDI + 0x1c) =
             (_Optional_payload_base<unsigned_int>)
             (pMVar3->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
             super__Optional_base<unsigned_int,_true,_true>._M_payload;
        *(undefined8 *)(in_RDI + 0x24) =
             *(undefined8 *)
              ((long)&(pMVar3->minTime).super__Optional_base<metaf::MetafTime,_true,_true>.
                      _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload + 8);
        *(undefined4 *)(in_RDI + 0x2c) =
             *(undefined4 *)
              &(pMVar3->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      }
    }
    bVar1 = Temperature::isReported((Temperature *)0x24bcf6);
    if (!bVar1) {
      std::optional<metaf::MinMaxTemperatureGroup>::operator->
                ((optional<metaf::MinMaxTemperatureGroup> *)0x24bd04);
      bVar1 = Temperature::isReported((Temperature *)0x24bd10);
      if (bVar1) {
        pMVar3 = std::optional<metaf::MinMaxTemperatureGroup>::operator->
                           ((optional<metaf::MinMaxTemperatureGroup> *)0x24bd20);
        *(_Optional_payload_base<int> *)(in_RDI + 0x10) =
             (pMVar3->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>;
        *(undefined2 *)(in_RDI + 0x18) = *(undefined2 *)&(pMVar3->maxTemp).freezing;
        pMVar3 = std::optional<metaf::MinMaxTemperatureGroup>::operator->
                           ((optional<metaf::MinMaxTemperatureGroup> *)0x24bd42);
        *(_Optional_payload_base<unsigned_int> *)(in_RDI + 0x30) =
             (_Optional_payload_base<unsigned_int>)
             (pMVar3->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
             super__Optional_base<unsigned_int,_true,_true>._M_payload;
        *(undefined8 *)(in_RDI + 0x38) =
             *(undefined8 *)
              ((long)&(pMVar3->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>.
                      _M_payload.super__Optional_payload_base<metaf::MetafTime>._M_payload + 8);
        *(undefined4 *)(in_RDI + 0x40) =
             *(undefined4 *)
              &(pMVar3->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_engaged;
      }
    }
    bVar1 = Temperature::isReported((Temperature *)0x24bd6e);
    if ((bVar1) && (bVar1 = Temperature::isReported((Temperature *)0x24bd82), bVar1)) {
      return APPENDED;
    }
    return NOT_APPENDED;
  }
  pMVar3 = std::optional<metaf::MinMaxTemperatureGroup>::operator->
                     ((optional<metaf::MinMaxTemperatureGroup> *)0x24bda5);
  *(_Optional_payload_base<int> *)(in_RDI + 0x10) =
       (pMVar3->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>;
  *(undefined2 *)(in_RDI + 0x18) = *(undefined2 *)&(pMVar3->maxTemp).freezing;
  pMVar3 = std::optional<metaf::MinMaxTemperatureGroup>::operator->
                     ((optional<metaf::MinMaxTemperatureGroup> *)0x24bdc7);
  *(_Optional_payload_base<unsigned_int> *)(in_RDI + 0x30) =
       (_Optional_payload_base<unsigned_int>)
       (pMVar3->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
       super__Optional_base<unsigned_int,_true,_true>._M_payload;
  *(undefined8 *)(in_RDI + 0x38) =
       *(undefined8 *)
        ((long)&(pMVar3->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
                super__Optional_payload_base<metaf::MetafTime>._M_payload + 8);
  *(undefined4 *)(in_RDI + 0x40) =
       *(undefined4 *)
        &(pMVar3->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged;
  bVar1 = Temperature::isFreezing((Temperature *)(in_RDI + 4));
  if (!bVar1) {
    bVar1 = Temperature::isFreezing((Temperature *)(in_RDI + 0x10));
    in_stack_ffffffffffffff78 = CONCAT13(1,(int3)in_stack_ffffffffffffff78);
    if (bVar1) goto LAB_0024be5e;
  }
  Temperature::temperature((Temperature *)CONCAT44(uVar2,in_stack_ffffffffffffff78));
  pfVar4 = std::optional<float>::operator*((optional<float> *)0x24be27);
  in_stack_ffffffffffffff74 = *pfVar4;
  Temperature::temperature((Temperature *)CONCAT44(uVar2,in_stack_ffffffffffffff78));
  pfVar4 = std::optional<float>::operator*((optional<float> *)0x24be4e);
  in_stack_ffffffffffffff78 =
       (uint)(*pfVar4 <= in_stack_ffffffffffffff74 && in_stack_ffffffffffffff74 != *pfVar4) << 0x18;
LAB_0024be5e:
  if ((char)((uint)in_stack_ffffffffffffff78 >> 0x18) != '\0') {
    std::swap<metaf::Temperature>((Temperature *)(in_RDI + 4),(Temperature *)(in_RDI + 0x10));
    std::swap<metaf::MetafTime>
              ((optional<metaf::MetafTime> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  *(undefined1 *)(in_RDI + 0x44) = 0;
  return APPENDED;
}

Assistant:

AppendResult MinMaxTemperatureGroup::appendForecast(const std::string & group) {
	static const auto error = AppendResult::NOT_APPENDED;
	if (minTemp.isReported() && maxTemp.isReported() && !isIncomplete) return error;
	const auto nextGroup = fromForecast(group);
	if (!nextGroup.has_value()) return error;
	if (isIncomplete != nextGroup->isIncomplete) return error;
	if (!isIncomplete) {
		// Minimum or maximum temperature point specified explicitly
		// Get minimum either from *this or from nextGroup, and maximum from other group
		// Make sure appending two minimums or two maximums will result in error
		if (minTemp.isReported() && nextGroup->minTemp.isReported()) return error;
		if (maxTemp.isReported() && nextGroup->maxTemp.isReported()) return error;
		if (!minTemp.isReported() && nextGroup->minTemp.isReported()) {
			minTemp = nextGroup->minTemp;
			minTime = nextGroup->minTime;
		}
		if (!maxTemp.isReported() && nextGroup->maxTemp.isReported()) {
			maxTemp = nextGroup->maxTemp;
			maxTime = nextGroup->maxTime;
		}
		if (!minTemp.isReported() || !maxTemp.isReported()) return error;
	} else {
		maxTemp = nextGroup->maxTemp;
		maxTime = nextGroup->maxTime;
		if ((!minTemp.isFreezing() && maxTemp.isFreezing()) || 
			*minTemp.temperature() > *maxTemp.temperature())
		{
			std::swap(minTemp, maxTemp);
			std::swap(minTime, maxTime);
		}
		isIncomplete = false;
	}
	return AppendResult::APPENDED;
}